

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O0

void __thiscall wasm::StringLifting::run(StringLifting *this,Module *module)

{
  initializer_list<wasm::Type> types;
  initializer_list<wasm::Type> types_00;
  initializer_list<wasm::Type> types_01;
  initializer_list<wasm::Type> types_02;
  initializer_list<wasm::Type> types_03;
  initializer_list<wasm::Type> types_04;
  initializer_list<wasm::Type> types_05;
  bool bVar1;
  uint uVar2;
  reference this_00;
  reference pCVar3;
  char *pcVar4;
  pointer pGVar5;
  size_t sVar6;
  Ref *pRVar7;
  element_type *peVar8;
  size_type sVar9;
  string_view *psVar10;
  mapped_type *pmVar11;
  pointer pFVar12;
  Fatal *pFVar13;
  ostream *poVar14;
  PassRunner *runner;
  string *defaultValue;
  string_view str;
  Name name;
  bool local_1dfb;
  FeatureSet local_1db4;
  undefined1 local_1db0 [8];
  StringApplier applier;
  Fatal local_1c60;
  uintptr_t local_1ad8;
  Type local_1ad0;
  Type TStack_1ac8;
  Type TStack_1ac0;
  iterator local_1ab8;
  undefined8 local_1ab0;
  Type local_1aa8;
  Signature local_1aa0;
  IString local_1a90;
  Fatal local_1a80;
  Type local_18f8;
  Type local_18f0;
  Type TStack_18e8;
  iterator local_18e0;
  undefined8 local_18d8;
  Type local_18d0;
  Signature local_18c8;
  IString local_18b8;
  Fatal local_18a8;
  Type local_1720;
  Type local_1718;
  Signature local_1710;
  IString local_1700;
  Fatal local_16f0;
  Type local_1568;
  Type local_1560;
  uintptr_t local_1558;
  iterator local_1550;
  undefined8 local_1548;
  Type local_1540;
  Signature local_1538;
  IString local_1528;
  Fatal local_1518;
  Type local_1390;
  Type local_1388;
  uintptr_t local_1380;
  iterator local_1378;
  undefined8 local_1370;
  Type local_1368;
  Signature local_1360;
  IString local_1350;
  Fatal local_1340;
  Type local_11b8;
  Type local_11b0;
  uintptr_t local_11a8;
  Type TStack_11a0;
  iterator local_1198;
  undefined8 local_1190;
  Type local_1188;
  Signature local_1180;
  IString local_1170;
  Fatal local_1160;
  uintptr_t local_fd8;
  Type local_fd0;
  uintptr_t local_fc8;
  iterator local_fc0;
  undefined8 local_fb8;
  Type local_fb0;
  Signature local_fa8;
  IString local_f98;
  Fatal local_f88;
  uintptr_t local_e00;
  Type local_df8;
  Signature local_df0;
  IString local_de0;
  Fatal local_dd0;
  uintptr_t local_c48;
  Type local_c40;
  Type TStack_c38;
  Type TStack_c30;
  iterator local_c28;
  undefined8 local_c20;
  Type local_c18;
  Signature local_c10;
  IString local_c00;
  undefined1 local_bf0 [8];
  Signature sig;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *func;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
  *__range2_1;
  HeapType HStack_bb8;
  BasicType i32;
  Type local_bb0;
  Type externref;
  Type local_ba0;
  Type refExtern;
  Array local_b88;
  HeapType local_b78;
  Type local_b70;
  Type array16;
  const_iterator local_b60;
  size_t local_b58;
  char *pcStack_b50;
  Name local_b40;
  Fatal local_b30;
  Fatal local_9a8;
  undefined1 local_820 [8];
  Ref item;
  allocator<char> local_681;
  string local_680;
  uint local_65c;
  undefined1 local_658 [4];
  Index index;
  reference local_648;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global_1;
  iterator __end3;
  iterator __begin3;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range3;
  undefined1 local_4a0 [8];
  Value array;
  vector<char,_std::allocator<char>_> copy;
  CustomSection *section;
  CustomSection *local_458;
  CustomSection *local_450;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  local_448;
  __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
  stringSectionIter;
  Name local_420;
  Fatal local_410;
  ostream *local_288;
  size_t sStack_280;
  undefined1 local_271;
  stringstream local_270 [7];
  bool valid;
  stringstream wtf16;
  String local_260 [376];
  undefined1 auStack_e8 [8];
  Name wtf8;
  unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *global;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
  *__range2;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  string local_50;
  undefined1 local_30 [8];
  Name stringConstsModule;
  bool found;
  Module *module_local;
  StringLifting *this_local;
  
  stringConstsModule.super_IString.str._M_str._7_1_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"string-constants-module",&local_71);
  pcVar4 = WasmStringConstsModule;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,pcVar4,(allocator<char> *)((long)&__range2 + 7));
  defaultValue = &local_a8;
  Pass::getArgumentOrDefault(&local_50,&this->super_Pass,&local_70,defaultValue);
  wasm::Name::Name((Name *)local_30,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  __end2 = std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::begin(&module->globals);
  global = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
           std::
           vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ::end(&module->globals);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                     *)&global), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
              ::operator*(&__end2);
    pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->(this_00);
    bVar1 = Importable::imported(&pGVar5->super_Importable);
    if (bVar1) {
      pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         (this_00);
      bVar1 = IString::operator==(&(pGVar5->super_Importable).module.super_IString,
                                  (IString *)local_30);
      if (bVar1) {
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (this_00);
        auStack_e8 = (undefined1  [8])(pGVar5->super_Importable).base.super_IString.str._M_len;
        wtf8.super_IString.str._M_len =
             (size_t)(pGVar5->super_Importable).base.super_IString.str._M_str;
        std::__cxx11::stringstream::stringstream(local_270);
        local_288 = (ostream *)auStack_e8;
        sStack_280 = wtf8.super_IString.str._M_len;
        str._M_str = (char *)defaultValue;
        str._M_len = wtf8.super_IString.str._M_len;
        local_271 = String::convertWTF8ToWTF16(local_260,(ostream *)auStack_e8,str);
        if (!(bool)local_271) {
          Fatal::Fatal(&local_410);
          pFVar13 = Fatal::operator<<(&local_410,(char (*) [21])"Bad string to lift: ");
          Fatal::operator<<(pFVar13,(Name *)auStack_e8);
          Fatal::~Fatal(&local_410);
        }
        std::__cxx11::stringstream::str();
        wasm::Name::Name(&local_420,(string *)&stringSectionIter);
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (this_00);
        pmVar11 = std::
                  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  ::operator[](&this->importedStrings,(key_type *)pGVar5);
        wasm::Name::operator=(pmVar11,&local_420);
        std::__cxx11::string::~string((string *)&stringSectionIter);
        stringConstsModule.super_IString.str._M_str._7_1_ = 1;
        std::__cxx11::stringstream::~stringstream(local_270);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
    ::operator++(&__end2);
  }
  local_450 = (CustomSection *)
              std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::begin
                        (&module->customSections);
  local_458 = (CustomSection *)
              std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end
                        (&module->customSections);
  local_448 = std::
              find_if<__gnu_cxx::__normal_iterator<wasm::CustomSection*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>,wasm::StringLifting::run(wasm::Module*)::_lambda(wasm::CustomSection&)_1_>
                        (local_450,local_458);
  section = (CustomSection *)
            std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::end
                      (&module->customSections);
  bVar1 = __gnu_cxx::operator!=
                    (&local_448,
                     (__normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
                      *)&section);
  if (bVar1) {
    pCVar3 = __gnu_cxx::
             __normal_iterator<wasm::CustomSection_*,_std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>_>
             ::operator*(&local_448);
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)&array.field_1.str.str._M_str,&pCVar3->data);
    json::Value::Value((Value *)local_4a0);
    pcVar4 = std::vector<char,_std::allocator<char>_>::data
                       ((vector<char,_std::allocator<char>_> *)&array.field_1.str.str._M_str);
    json::Value::parse((Value *)local_4a0,pcVar4,WTF16);
    bVar1 = json::Value::isArray((Value *)local_4a0);
    if (!bVar1) {
      Fatal::Fatal((Fatal *)&__range3);
      Fatal::operator<<((Fatal *)&__range3,
                        (char (*) [59])"StringLifting: string.const section should be a JSON array")
      ;
      Fatal::~Fatal((Fatal *)&__range3);
    }
    __end3 = std::
             vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
             ::begin(&module->globals);
    global_1 = (unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_> *)
               std::
               vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
               ::end(&module->globals);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                                       *)&global_1), bVar1) {
      local_648 = __gnu_cxx::
                  __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
                  ::operator*(&__end3);
      pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                         (local_648);
      bVar1 = Importable::imported(&pGVar5->super_Importable);
      local_1dfb = true;
      if (bVar1) {
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_648);
        IString::IString((IString *)local_658,"string.const");
        local_1dfb = IString::operator!=(&(pGVar5->super_Importable).module.super_IString,
                                         (IString *)local_658);
      }
      if (local_1dfb == false) {
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_648);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)&local_680,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   &(pGVar5->super_Importable).base,&local_681);
        uVar2 = std::__cxx11::stoi(&local_680,(size_t *)0x0,10);
        std::__cxx11::string::~string((string *)&local_680);
        std::allocator<char>::~allocator(&local_681);
        local_65c = uVar2;
        sVar6 = json::Value::size((Value *)local_4a0);
        if (sVar6 <= uVar2) {
          Fatal::Fatal((Fatal *)&item.super_shared_ptr<json::Value>.
                                 super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount);
          Fatal::operator<<((Fatal *)&item.super_shared_ptr<json::Value>.
                                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                      _M_refcount,
                            (char (*) [49])"StringLifting: bad index in string.const section");
          Fatal::~Fatal((Fatal *)&item.super_shared_ptr<json::Value>.
                                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
        }
        pRVar7 = json::Value::operator[]((Value *)local_4a0,local_65c);
        json::Value::Ref::Ref((Ref *)local_820,pRVar7);
        peVar8 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_820);
        bVar1 = json::Value::isString(peVar8);
        if (!bVar1) {
          Fatal::Fatal(&local_9a8);
          Fatal::operator<<(&local_9a8,
                            (char (*) [58])
                            "StringLifting: string.const section entry is not a string");
          Fatal::~Fatal(&local_9a8);
        }
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_648);
        sVar9 = std::
                unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                ::count(&this->importedStrings,(key_type *)pGVar5);
        if (sVar9 != 0) {
          Fatal::Fatal(&local_b30);
          Fatal::operator<<(&local_b30,
                            (char (*) [57])
                            "StringLifting: string.const section tramples other const");
          Fatal::~Fatal(&local_b30);
        }
        peVar8 = std::__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<json::Value,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_820);
        psVar10 = &json::Value::getIString(peVar8)->str;
        local_b58 = psVar10->_M_len;
        pcStack_b50 = psVar10->_M_str;
        wasm::Name::Name(&local_b40,(IString)*psVar10);
        pGVar5 = std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>::operator->
                           (local_648);
        pmVar11 = std::
                  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
                  ::operator[](&this->importedStrings,(key_type *)pGVar5);
        wasm::Name::operator=(pmVar11,&local_b40);
        json::Value::Ref::~Ref((Ref *)local_820);
      }
      __gnu_cxx::
      __normal_iterator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_*,_std::vector<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>_>
      ::operator++(&__end3);
    }
    __gnu_cxx::
    __normal_iterator<wasm::CustomSection_const*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>
    ::__normal_iterator<wasm::CustomSection*>
              ((__normal_iterator<wasm::CustomSection_const*,std::vector<wasm::CustomSection,std::allocator<wasm::CustomSection>>>
                *)&local_b60,&local_448);
    array16.id = (uintptr_t)
                 std::vector<wasm::CustomSection,_std::allocator<wasm::CustomSection>_>::erase
                           (&module->customSections,local_b60);
    json::Value::~Value((Value *)local_4a0);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)&array.field_1.str.str._M_str);
  }
  Field::Field((Field *)&refExtern,i16,Mutable);
  Array::Array(&local_b88,_refExtern);
  HeapType::HeapType(&local_b78,&local_b88);
  wasm::Type::Type(&local_b70,local_b78,Nullable,Inexact);
  HeapType::HeapType((HeapType *)&externref,ext);
  wasm::Type::Type(&local_ba0,(HeapType)externref.id,NonNullable,Inexact);
  HeapType::HeapType(&stack0xfffffffffffff448,ext);
  wasm::Type::Type(&local_bb0,HStack_bb8,Nullable,Inexact);
  __end2_1 = std::
             vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ::begin(&module->functions);
  func = (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
         std::
         vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
         ::end(&module->functions);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
                        *)&func);
    if (!bVar1) {
      if ((stringConstsModule.super_IString.str._M_str._7_1_ & 1) != 0) {
        run(wasm::Module*)::StringApplier::StringApplier(wasm::StringLifting_const__
                  (local_1db0,this);
        runner = Pass::getPassRunner(&this->super_Pass);
        WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>::run
                  ((WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                    *)local_1db0,runner,module);
        Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_>::walkModuleCode
                  ((Walker<StringApplier,_wasm::Visitor<StringApplier,_void>_> *)
                   ((long)&applier.
                           super_WalkerPass<wasm::PostWalker<StringApplier,_wasm::Visitor<StringApplier,_void>_>_>
                           .super_Pass.passArg.
                           super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                           ._M_payload.
                           super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   + 0x20),module);
        FeatureSet::FeatureSet(&local_1db4,0x4000);
        FeatureSet::enable(&module->features,&local_1db4);
        run::StringApplier::~StringApplier((StringApplier *)local_1db0);
      }
      return;
    }
    sig.results.id =
         (uintptr_t)
         __gnu_cxx::
         __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
         ::operator*(&__end2_1);
    pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                        ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                         sig.results.id);
    bVar1 = Importable::imported(&pFVar12->super_Importable);
    if (bVar1) {
      pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                          ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                           sig.results.id);
      bVar1 = IString::operator!=(&(pFVar12->super_Importable).module.super_IString,
                                  (IString *)WasmStringsModule);
      if (!bVar1) {
        pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                             sig.results.id);
        _local_bf0 = HeapType::getSignature(&pFVar12->type);
        pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::operator->
                            ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                             sig.results.id);
        IString::IString(&local_c00,"fromCharCodeArray");
        bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,&local_c00);
        if (bVar1) {
          local_c40.id = local_b70.id;
          wasm::Type::Type(&TStack_c38,i32);
          wasm::Type::Type(&TStack_c30,i32);
          local_c28 = &local_c40;
          local_c20 = 3;
          types_05._M_len = 3;
          types_05._M_array = local_c28;
          wasm::Type::Type(&local_c18,types_05);
          local_c48 = local_ba0.id;
          Signature::Signature(&local_c10,local_c18,local_ba0);
          bVar1 = Signature::operator!=((Signature *)local_bf0,&local_c10);
          if (bVar1) {
            Fatal::Fatal(&local_dd0);
            pFVar13 = Fatal::operator<<(&local_dd0,
                                        (char (*) [53])
                                        "StringLifting: bad signature for fromCharCodeArray: ");
            Fatal::operator<<(pFVar13,(Signature *)local_bf0);
            Fatal::~Fatal(&local_dd0);
          }
          pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                    operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               sig.results.id);
          wasm::Name::operator=(&this->fromCharCodeArrayImport,(Name *)pFVar12);
          stringConstsModule.super_IString.str._M_str._7_1_ = 1;
        }
        else {
          pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                    operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                               sig.results.id);
          IString::IString(&local_de0,"fromCodePoint");
          bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,&local_de0);
          if (bVar1) {
            wasm::Type::Type(&local_df8,i32);
            local_e00 = local_ba0.id;
            Signature::Signature(&local_df0,local_df8,local_ba0);
            bVar1 = Signature::operator!=((Signature *)local_bf0,&local_df0);
            if (bVar1) {
              Fatal::Fatal(&local_f88);
              pFVar13 = Fatal::operator<<(&local_f88,
                                          (char (*) [49])
                                          "StringLifting: bad signature for fromCodePoint: ");
              Fatal::operator<<(pFVar13,(Signature *)local_bf0);
              Fatal::~Fatal(&local_f88);
            }
            pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                      operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *
                                 )sig.results.id);
            wasm::Name::operator=(&this->fromCodePointImport,(Name *)pFVar12);
            stringConstsModule.super_IString.str._M_str._7_1_ = 1;
          }
          else {
            pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                      operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *
                                 )sig.results.id);
            IString::IString(&local_f98,"concat");
            bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,&local_f98);
            if (bVar1) {
              local_fd0.id = local_bb0.id;
              local_fc8 = local_bb0.id;
              local_fc0 = &local_fd0;
              local_fb8 = 2;
              types_04._M_len = 2;
              types_04._M_array = local_fc0;
              wasm::Type::Type(&local_fb0,types_04);
              local_fd8 = local_ba0.id;
              Signature::Signature(&local_fa8,local_fb0,local_ba0);
              bVar1 = Signature::operator!=((Signature *)local_bf0,&local_fa8);
              if (bVar1) {
                Fatal::Fatal(&local_1160);
                pFVar13 = Fatal::operator<<(&local_1160,
                                            (char (*) [42])
                                            "StringLifting: bad signature for concta: ");
                Fatal::operator<<(pFVar13,(Signature *)local_bf0);
                Fatal::~Fatal(&local_1160);
              }
              pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                        operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                    *)sig.results.id);
              wasm::Name::operator=(&this->concatImport,(Name *)pFVar12);
              stringConstsModule.super_IString.str._M_str._7_1_ = 1;
            }
            else {
              pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                        operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                    *)sig.results.id);
              IString::IString(&local_1170,"intoCharCodeArray");
              bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,
                                          &local_1170);
              if (bVar1) {
                local_11b0.id = local_bb0.id;
                local_11a8 = local_b70.id;
                wasm::Type::Type(&TStack_11a0,i32);
                local_1198 = &local_11b0;
                local_1190 = 3;
                types_03._M_len = 3;
                types_03._M_array = local_1198;
                wasm::Type::Type(&local_1188,types_03);
                wasm::Type::Type(&local_11b8,i32);
                Signature::Signature(&local_1180,local_1188,local_11b8);
                bVar1 = Signature::operator!=((Signature *)local_bf0,&local_1180);
                if (bVar1) {
                  Fatal::Fatal(&local_1340);
                  pFVar13 = Fatal::operator<<(&local_1340,
                                              (char (*) [53])
                                              "StringLifting: bad signature for intoCharCodeArray: "
                                             );
                  Fatal::operator<<(pFVar13,(Signature *)local_bf0);
                  Fatal::~Fatal(&local_1340);
                }
                pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                          operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                      *)sig.results.id);
                wasm::Name::operator=(&this->intoCharCodeArrayImport,(Name *)pFVar12);
                stringConstsModule.super_IString.str._M_str._7_1_ = 1;
              }
              else {
                pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                          operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                      *)sig.results.id);
                IString::IString(&local_1350,"equals");
                bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,
                                            &local_1350);
                if (bVar1) {
                  local_1388.id = local_bb0.id;
                  local_1380 = local_bb0.id;
                  local_1378 = &local_1388;
                  local_1370 = 2;
                  types_02._M_len = 2;
                  types_02._M_array = local_1378;
                  wasm::Type::Type(&local_1368,types_02);
                  wasm::Type::Type(&local_1390,i32);
                  Signature::Signature(&local_1360,local_1368,local_1390);
                  bVar1 = Signature::operator!=((Signature *)local_bf0,&local_1360);
                  if (bVar1) {
                    Fatal::Fatal(&local_1518);
                    pFVar13 = Fatal::operator<<(&local_1518,
                                                (char (*) [42])
                                                "StringLifting: bad signature for equals: ");
                    Fatal::operator<<(pFVar13,(Signature *)local_bf0);
                    Fatal::~Fatal(&local_1518);
                  }
                  pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                            operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                        *)sig.results.id);
                  wasm::Name::operator=(&this->equalsImport,(Name *)pFVar12);
                  stringConstsModule.super_IString.str._M_str._7_1_ = 1;
                }
                else {
                  pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                            operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                        *)sig.results.id);
                  IString::IString(&local_1528,"compare");
                  bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,
                                              &local_1528);
                  if (bVar1) {
                    local_1560.id = local_bb0.id;
                    local_1558 = local_bb0.id;
                    local_1550 = &local_1560;
                    local_1548 = 2;
                    types_01._M_len = 2;
                    types_01._M_array = local_1550;
                    wasm::Type::Type(&local_1540,types_01);
                    wasm::Type::Type(&local_1568,i32);
                    Signature::Signature(&local_1538,local_1540,local_1568);
                    bVar1 = Signature::operator!=((Signature *)local_bf0,&local_1538);
                    if (bVar1) {
                      Fatal::Fatal(&local_16f0);
                      pFVar13 = Fatal::operator<<(&local_16f0,
                                                  (char (*) [43])
                                                  "StringLifting: bad signature for compare: ");
                      Fatal::operator<<(pFVar13,(Signature *)local_bf0);
                      Fatal::~Fatal(&local_16f0);
                    }
                    pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                              ::operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                            *)sig.results.id);
                    wasm::Name::operator=(&this->compareImport,(Name *)pFVar12);
                    stringConstsModule.super_IString.str._M_str._7_1_ = 1;
                  }
                  else {
                    pFVar12 = std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                              ::operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                            *)sig.results.id);
                    IString::IString(&local_1700,"length");
                    bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,
                                                &local_1700);
                    if (bVar1) {
                      local_1718.id = local_bb0.id;
                      wasm::Type::Type(&local_1720,i32);
                      Signature::Signature(&local_1710,local_1718,local_1720);
                      bVar1 = Signature::operator!=((Signature *)local_bf0,&local_1710);
                      if (bVar1) {
                        Fatal::Fatal(&local_18a8);
                        pFVar13 = Fatal::operator<<(&local_18a8,
                                                    (char (*) [42])
                                                    "StringLifting: bad signature for length: ");
                        Fatal::operator<<(pFVar13,(Signature *)local_bf0);
                        Fatal::~Fatal(&local_18a8);
                      }
                      pFVar12 = std::
                                unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                                operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                            *)sig.results.id);
                      wasm::Name::operator=(&this->lengthImport,(Name *)pFVar12);
                      stringConstsModule.super_IString.str._M_str._7_1_ = 1;
                    }
                    else {
                      pFVar12 = std::
                                unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                                operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                            *)sig.results.id);
                      IString::IString(&local_18b8,"charCodeAt");
                      bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,
                                                  &local_18b8);
                      if (bVar1) {
                        local_18f0.id = local_bb0.id;
                        wasm::Type::Type(&TStack_18e8,i32);
                        local_18e0 = &local_18f0;
                        local_18d8 = 2;
                        types_00._M_len = 2;
                        types_00._M_array = local_18e0;
                        wasm::Type::Type(&local_18d0,types_00);
                        wasm::Type::Type(&local_18f8,i32);
                        Signature::Signature(&local_18c8,local_18d0,local_18f8);
                        bVar1 = Signature::operator!=((Signature *)local_bf0,&local_18c8);
                        if (bVar1) {
                          Fatal::Fatal(&local_1a80);
                          pFVar13 = Fatal::operator<<(&local_1a80,
                                                      (char (*) [46])
                                                                                                            
                                                  "StringLifting: bad signature for charCodeAt: ");
                          Fatal::operator<<(pFVar13,(Signature *)local_bf0);
                          Fatal::~Fatal(&local_1a80);
                        }
                        pFVar12 = std::
                                  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                                  operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                              *)sig.results.id);
                        wasm::Name::operator=(&this->charCodeAtImport,(Name *)pFVar12);
                        stringConstsModule.super_IString.str._M_str._7_1_ = 1;
                      }
                      else {
                        pFVar12 = std::
                                  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::
                                  operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                              *)sig.results.id);
                        IString::IString(&local_1a90,"substring");
                        bVar1 = IString::operator==(&(pFVar12->super_Importable).base.super_IString,
                                                    &local_1a90);
                        if (bVar1) {
                          local_1ad0.id = local_bb0.id;
                          wasm::Type::Type(&TStack_1ac8,i32);
                          wasm::Type::Type(&TStack_1ac0,i32);
                          local_1ab8 = &local_1ad0;
                          local_1ab0 = 3;
                          types._M_len = 3;
                          types._M_array = local_1ab8;
                          wasm::Type::Type(&local_1aa8,types);
                          local_1ad8 = local_ba0.id;
                          Signature::Signature(&local_1aa0,local_1aa8,local_ba0);
                          bVar1 = Signature::operator!=((Signature *)local_bf0,&local_1aa0);
                          if (bVar1) {
                            Fatal::Fatal(&local_1c60);
                            pFVar13 = Fatal::operator<<(&local_1c60,
                                                        (char (*) [45])
                                                                                                                
                                                  "StringLifting: bad signature for substring: ");
                            Fatal::operator<<(pFVar13,(Signature *)local_bf0);
                            Fatal::~Fatal(&local_1c60);
                          }
                          pFVar12 = std::
                                    unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ::operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                                  *)sig.results.id);
                          wasm::Name::operator=(&this->substringImport,(Name *)pFVar12);
                          stringConstsModule.super_IString.str._M_str._7_1_ = 1;
                        }
                        else {
                          poVar14 = std::operator<<((ostream *)&std::cerr,
                                                    "warning: unknown strings import: ");
                          pFVar12 = std::
                                    unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                    ::operator->((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>
                                                  *)sig.results.id);
                          applier._312_8_ =
                               (pFVar12->super_Importable).base.super_IString.str._M_len;
                          name.super_IString.str._M_str = (char *)applier._312_8_;
                          name.super_IString.str._M_len =
                               (size_t)(pFVar12->super_Importable).base.super_IString.str._M_str;
                          poVar14 = wasm::operator<<((wasm *)poVar14,(ostream *)applier._312_8_,name
                                                    );
                          std::operator<<(poVar14,'\n');
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_*,_std::vector<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>_>
    ::operator++(&__end2_1);
  } while( true );
}

Assistant:

void run(Module* module) override {
    // Whether we found any work to do.
    bool found = false;

    // Imported string constants look like
    //
    //   (import "\'" "bar" (global $string.bar.internal.name (ref extern)))
    //
    // That is, they are imported from module "'" and the basename is the
    // actual string. Find them all so we can apply them.
    Name stringConstsModule =
      getArgumentOrDefault("string-constants-module", WasmStringConstsModule);
    for (auto& global : module->globals) {
      if (!global->imported()) {
        continue;
      }
      if (global->module == stringConstsModule) {
        // Encode from WTF-8 to WTF-16.
        auto wtf8 = global->base;
        std::stringstream wtf16;
        bool valid = String::convertWTF8ToWTF16(wtf16, wtf8.str);
        if (!valid) {
          Fatal() << "Bad string to lift: " << wtf8;
        }
        importedStrings[global->name] = wtf16.str();
        found = true;
      }
    }

    // Imported strings may also be found in the string section.
    auto stringSectionIter = std::find_if(
      module->customSections.begin(),
      module->customSections.end(),
      [&](CustomSection& section) { return section.name == "string.consts"; });
    if (stringSectionIter != module->customSections.end()) {
      // We found the string consts section. Parse it.
      auto& section = *stringSectionIter;
      auto copy = section.data;
      json::Value array;
      array.parse(copy.data(), json::Value::WTF16);
      if (!array.isArray()) {
        Fatal() << "StringLifting: string.const section should be a JSON array";
      }

      // We have the array of constants from the section. Find globals that
      // refer to it.
      for (auto& global : module->globals) {
        if (!global->imported() || global->module != "string.const") {
          continue;
        }
        // The index in the array is the basename.
        Index index = std::stoi(std::string(global->base.str));
        if (index >= array.size()) {
          Fatal() << "StringLifting: bad index in string.const section";
        }
        auto item = array[index];
        if (!item->isString()) {
          Fatal()
            << "StringLifting: string.const section entry is not a string";
        }
        if (importedStrings.count(global->name)) {
          Fatal() << "StringLifting: string.const section tramples other const";
        }
        importedStrings[global->name] = item->getIString();
      }

      // Remove the custom section: After lifting it has no purpose (and could
      // cause problems with repeated lifting/lowering).
      module->customSections.erase(stringSectionIter);
    }

    auto array16 = Type(Array(Field(Field::i16, Mutable)), Nullable);
    auto refExtern = Type(HeapType::ext, NonNullable);
    auto externref = Type(HeapType::ext, Nullable);
    auto i32 = Type::i32;

    // Find imported string functions.
    for (auto& func : module->functions) {
      if (!func->imported() || func->module != WasmStringsModule) {
        continue;
      }
      auto sig = func->type.getSignature();
      if (func->base == "fromCharCodeArray") {
        if (sig != Signature({array16, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCharCodeArray: "
                  << sig;
        }
        fromCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "fromCodePoint") {
        if (sig != Signature(i32, refExtern)) {
          Fatal() << "StringLifting: bad signature for fromCodePoint: " << sig;
        }
        fromCodePointImport = func->name;
        found = true;
      } else if (func->base == "concat") {
        if (sig != Signature({externref, externref}, refExtern)) {
          Fatal() << "StringLifting: bad signature for concta: " << sig;
        }
        concatImport = func->name;
        found = true;
      } else if (func->base == "intoCharCodeArray") {
        if (sig != Signature({externref, array16, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for intoCharCodeArray: "
                  << sig;
        }
        intoCharCodeArrayImport = func->name;
        found = true;
      } else if (func->base == "equals") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for equals: " << sig;
        }
        equalsImport = func->name;
        found = true;
      } else if (func->base == "compare") {
        if (sig != Signature({externref, externref}, i32)) {
          Fatal() << "StringLifting: bad signature for compare: " << sig;
        }
        compareImport = func->name;
        found = true;
      } else if (func->base == "length") {
        if (sig != Signature({externref}, i32)) {
          Fatal() << "StringLifting: bad signature for length: " << sig;
        }
        lengthImport = func->name;
        found = true;
      } else if (func->base == "charCodeAt") {
        if (sig != Signature({externref, i32}, i32)) {
          Fatal() << "StringLifting: bad signature for charCodeAt: " << sig;
        }
        charCodeAtImport = func->name;
        found = true;
      } else if (func->base == "substring") {
        if (sig != Signature({externref, i32, i32}, refExtern)) {
          Fatal() << "StringLifting: bad signature for substring: " << sig;
        }
        substringImport = func->name;
        found = true;
      } else {
        std::cerr << "warning: unknown strings import: " << func->base << '\n';
      }
    }

    if (!found) {
      // Nothing to do.
      return;
    }

    struct StringApplier : public WalkerPass<PostWalker<StringApplier>> {
      bool isFunctionParallel() override { return true; }

      const StringLifting& parent;

      StringApplier(const StringLifting& parent) : parent(parent) {}

      std::unique_ptr<Pass> create() override {
        return std::make_unique<StringApplier>(parent);
      }

      bool modified = false;

      void visitGlobalGet(GlobalGet* curr) {
        // Replace global.gets of imported strings with string.const.
        auto iter = parent.importedStrings.find(curr->name);
        if (iter != parent.importedStrings.end()) {
          auto wtf16 = iter->second;
          replaceCurrent(Builder(*getModule()).makeStringConst(wtf16.str));
          modified = true;
        }
      }

      void visitCall(Call* curr) {
        // Replace calls of imported string methods with stringref operations.
        if (curr->target == parent.fromCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringNew(StringNewWTF16Array,
                                          curr->operands[0],
                                          curr->operands[1],
                                          curr->operands[2]));
        } else if (curr->target == parent.fromCodePointImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringNew(StringNewFromCodePoint, curr->operands[0]));
        } else if (curr->target == parent.concatImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringConcat(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.intoCharCodeArrayImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEncode(StringEncodeWTF16Array,
                                             curr->operands[0],
                                             curr->operands[1],
                                             curr->operands[2]));
        } else if (curr->target == parent.equalsImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqEqual,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.compareImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringEq(StringEqCompare,
                                         curr->operands[0],
                                         curr->operands[1]));
        } else if (curr->target == parent.lengthImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringMeasure(StringMeasureWTF16, curr->operands[0]));
        } else if (curr->target == parent.charCodeAtImport) {
          replaceCurrent(
            Builder(*getModule())
              .makeStringWTF16Get(curr->operands[0], curr->operands[1]));
        } else if (curr->target == parent.substringImport) {
          replaceCurrent(Builder(*getModule())
                           .makeStringSliceWTF(curr->operands[0],
                                               curr->operands[1],
                                               curr->operands[2]));
        }
      }

      void visitFunction(Function* curr) {
        // If we made modifications then we need to refinalize, as we replace
        // externrefs with stringrefs, a subtype.
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, getModule());
        }
      }
    };

    StringApplier applier(*this);
    applier.run(getPassRunner(), module);
    applier.walkModuleCode(module);

    // TODO: Add casts. We generate new string.* instructions, and all their
    //       string inputs should be stringref, not externref, but we have not
    //       converted all externrefs to stringrefs (since some externrefs might
    //       be something else). It is not urgent to fix this as the validator
    //       accepts externrefs there atm, and since toolchains will lower
    //       strings out at the end anyhow (which would remove such casts). Note
    //       that if we add a type import for stringref then this problem would
    //       become a lot simpler (we'd convert that type to stringref).

    // Enable the feature so the module validates.
    module->features.enable(FeatureSet::Strings);
  }